

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O0

size_t __thiscall tcmalloc::CentralFreeList::OverheadBytes(CentralFreeList *this)

{
  int32_t iVar1;
  SizeMap *pSVar2;
  size_t sVar3;
  size_t overhead_per_span;
  size_t object_size;
  size_t pages_per_span;
  SpinLockHolder local_20;
  SpinLockHolder h;
  CentralFreeList *this_local;
  
  h.lock_ = &this->lock_;
  SpinLockHolder::SpinLockHolder(&local_20,&this->lock_);
  if (this->size_class_ == 0) {
    this_local = (CentralFreeList *)0x0;
  }
  else {
    pSVar2 = Static::sizemap();
    sVar3 = SizeMap::class_to_pages(pSVar2,(uint32_t)this->size_class_);
    pSVar2 = Static::sizemap();
    iVar1 = SizeMap::class_to_size(pSVar2,(uint32_t)this->size_class_);
    this_local = (CentralFreeList *)(this->num_spans_ * ((sVar3 << 0xd) % (ulong)(long)iVar1));
  }
  SpinLockHolder::~SpinLockHolder(&local_20);
  return (size_t)this_local;
}

Assistant:

size_t CentralFreeList::OverheadBytes() {
  SpinLockHolder h(&lock_);
  if (size_class_ == 0) {  // 0 holds the 0-sized allocations
    return 0;
  }
  const size_t pages_per_span = Static::sizemap()->class_to_pages(size_class_);
  const size_t object_size = Static::sizemap()->class_to_size(size_class_);
  ASSERT(object_size > 0);
  const size_t overhead_per_span = (pages_per_span * kPageSize) % object_size;
  return num_spans_ * overhead_per_span;
}